

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QPoint *pos)

{
  Picker *this_00;
  ulong uVar1;
  QModelIndex index;
  QModelIndex local_50;
  QString local_38;
  
  indexForPos(&local_50,this,pos);
  if ((((-1 < local_50.r) && (-1 < local_50.c)) && (local_50.m != (QAbstractItemModel *)0x0)) &&
     (local_50.m != (QAbstractItemModel *)0x0)) {
    uVar1 = (**(code **)(*(long *)local_50.m + 0x138))(local_50.m,&local_50);
    if ((uVar1 & 0x20) != 0) {
      setCurrentIndex(this,&local_50);
      this_00 = this->q;
      itemText(&local_38,this,&local_50);
      Picker::activated(this_00,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
        }
      }
      Picker::activated(this->q,local_50.r);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QPoint & pos )
{
	const QModelIndex index = indexForPos( pos );

	if( index.isValid() && ( index.flags() & Qt::ItemIsEnabled ) )
	{
		setCurrentIndex( index );
		emit q->activated( itemText( index ) );
		emit q->activated( index.row() );
	}
}